

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.cpp
# Opt level: O1

string * __thiscall
pbrt::ThreadPool::ToString_abi_cxx11_(string *__return_storage_ptr__,ThreadPool *this)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  ParallelJob *pPVar4;
  string s;
  string local_a0;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string *local_60;
  pthread_mutex_t *local_58;
  long *local_50 [2];
  long local_40 [2];
  
  local_80 = (long *)((long)(this->threads).
                            super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(this->threads).
                            super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  detail::stringPrintfRecursive<unsigned_long,bool_const&>
            (&local_a0,"[ ThreadPool threads.size(): %d shutdownThreads: %s ",
             (unsigned_long *)&local_80,&this->shutdownThreads);
  iVar1 = pthread_mutex_trylock((pthread_mutex_t *)&this->jobListMutex);
  if (iVar1 == 0) {
    local_58 = (pthread_mutex_t *)&this->jobListMutex;
    std::__cxx11::string::append((char *)&local_a0);
    pPVar4 = this->jobList;
    local_60 = __return_storage_ptr__;
    if (pPVar4 != (ParallelJob *)0x0) {
      do {
        (*pPVar4->_vptr_ParallelJob[4])(local_50,pPVar4);
        plVar2 = (long *)std::__cxx11::string::append((char *)local_50);
        plVar3 = plVar2 + 2;
        if ((long *)*plVar2 == plVar3) {
          local_70 = *plVar3;
          lStack_68 = plVar2[3];
          local_80 = &local_70;
        }
        else {
          local_70 = *plVar3;
          local_80 = (long *)*plVar2;
        }
        local_78 = plVar2[1];
        *plVar2 = (long)plVar3;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_80);
        if (local_80 != &local_70) {
          operator_delete(local_80,local_70 + 1);
        }
        if (local_50[0] != local_40) {
          operator_delete(local_50[0],local_40[0] + 1);
        }
        pPVar4 = pPVar4->next;
      } while (pPVar4 != (ParallelJob *)0x0);
    }
    std::__cxx11::string::append((char *)&local_a0);
    pthread_mutex_unlock(local_58);
    __return_storage_ptr__ = local_60;
  }
  else {
    std::__cxx11::string::append((char *)&local_a0);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,local_a0._M_dataplus._M_p,
             local_a0._M_dataplus._M_p + local_a0._M_string_length);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,
                    CONCAT71(local_a0.field_2._M_allocated_capacity._1_7_,
                             local_a0.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ThreadPool::ToString() const {
    std::string s = StringPrintf("[ ThreadPool threads.size(): %d shutdownThreads: %s ",
                                 threads.size(), shutdownThreads);
    if (jobListMutex.try_lock()) {
        s += "jobList: [ ";
        ParallelJob *job = jobList;
        while (job) {
            s += job->ToString() + " ";
            job = job->next;
        }
        s += "] ";
        jobListMutex.unlock();
    } else
        s += "(job list mutex locked) ";
    return s + "]";
}